

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> * __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
emplace_back<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this,
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *args)

{
  json_storage_kind jVar1;
  array_storage *this_00;
  string *s;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RSI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  json_array<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
  *in_stack_ffffffffffffffa0;
  json_runtime_error<std::domain_error,_void> *this_01;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_8;
  
  jVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::storage_kind(in_RDI);
  if (jVar1 == json_reference) {
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_ffffffffffffffa0);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::json_reference_storage::value
              ((json_reference_storage *)0x4ebd7e);
    local_8 = emplace_back<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                        (in_RSI,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                                in_stack_ffffffffffffffe0);
  }
  else {
    if (jVar1 != array) {
      s = (string *)__cxa_allocate_exception(0x18);
      this_01 = (json_runtime_error<std::domain_error,_void> *)&stack0xffffffffffffffc7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      json_runtime_error<std::domain_error,_void>::json_runtime_error(this_01,s);
      __cxa_throw(s,&json_runtime_error<std::domain_error,void>::typeinfo,
                  json_runtime_error<std::domain_error,_void>::~json_runtime_error);
    }
    this_00 = cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         in_stack_ffffffffffffffa0);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_storage::value(this_00);
    local_8 = json_array<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>
              ::
              emplace_back<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                        (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return local_8;
}

Assistant:

basic_json& emplace_back(Args&&... args)
        {
            switch (storage_kind())
            {
                case json_storage_kind::array:
                    return cast<array_storage>().value().emplace_back(std::forward<Args>(args)...);
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().emplace_back(std::forward<Args>(args)...);
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Attempting to insert into a value that is not an array"));
            }
        }